

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O3

int main(void)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  service *psVar3;
  io_context io_context;
  io_context local_70;
  error_code local_60;
  system_error local_50;
  
  boost::asio::io_context::io_context(&local_70);
  boost::system::error_code::error_code(&local_60);
  boost::asio::detail::scheduler::run(local_70.impl_,&local_60);
  if (local_60.failed_ == true) {
    std::runtime_error::runtime_error(&local_50.super_runtime_error,"");
    local_50.m_what._M_dataplus._M_p = (pointer)((long)&local_50 + 0x30);
    local_50._0_8_ = &PTR__system_error_0010d840;
    local_50.m_error_code.cat_ = local_60.cat_;
    local_50.m_what._M_string_length = 0;
    local_50.m_what.field_2._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>(&local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, World!",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  psVar3 = (local_70.super_execution_context.service_registry_)->first_service_;
  eVar2.service_registry_ = local_70.super_execution_context.service_registry_;
  if (psVar3 != (service *)0x0) {
    do {
      (*psVar3->_vptr_service[2])(psVar3);
      eVar2.service_registry_ = local_70.super_execution_context.service_registry_;
      psVar3 = psVar3->next_;
    } while (psVar3 != (service *)0x0);
    psVar3 = (local_70.super_execution_context.service_registry_)->first_service_;
    if (psVar3 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar3->_vptr_service;
        psVar3 = psVar3->next_;
        (*(*ppp_Var1)[1])();
        (eVar2.service_registry_)->first_service_ = psVar3;
      } while (psVar3 != (service *)0x0);
      eVar2.service_registry_ = local_70.super_execution_context.service_registry_;
      if (local_70.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar2.service_registry_ = (service_registry *)0x0;
        goto LAB_00107881;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar2.service_registry_)->mutex_);
LAB_00107881:
  operator_delete(eVar2.service_registry_);
  return 0;
}

Assistant:

int main() {
  boost::asio::io_context io_context;
  io_context.run();

  std::cout << "Hello, World!" << std::endl;

  return 0;
}